

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

bool CoreML::Specification::ImageFeatureType_ColorSpace_IsValid(int value)

{
  bool local_9;
  int value_local;
  
  if ((((value == 0) || (value == 10)) || (value == 0x14)) || ((value == 0x1e || (value == 0x28))))
  {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool ImageFeatureType_ColorSpace_IsValid(int value) {
  switch (value) {
    case 0:
    case 10:
    case 20:
    case 30:
    case 40:
      return true;
    default:
      return false;
  }
}